

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O3

const_dag_iterator * __thiscall
spvtools::opt::SENode::graph_cend(const_dag_iterator *__return_storage_ptr__,SENode *this)

{
  pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>
  local_20;
  
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  __return_storage_ptr__->current_ = (NodePtr)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->parent_iterators_).c.
  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                       *)&__return_storage_ptr__->parent_iterators_,0);
  local_20.first = __return_storage_ptr__->current_;
  if ((local_20.first != (NodePtr)0x0) &&
     (local_20.second._M_current =
           ((local_20.first)->children_).
           super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
           _M_impl.super__Vector_impl_data._M_start,
     local_20.second._M_current !=
     ((local_20.first)->children_).
     super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    std::
    deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>
    ::
    emplace_back<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>
              ((deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>
                *)&__return_storage_ptr__->parent_iterators_,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

const_dag_iterator graph_cend() const { return const_dag_iterator(); }